

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O1

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra>::Integrate
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra> *this,int variable,TPZVec<double> *value)

{
  long lVar1;
  double dVar2;
  TPZMaterialDataT<double> *pTVar3;
  long lVar4;
  TPZGeoEl *pTVar5;
  long *plVar6;
  long lVar7;
  TPZSolVec<double> *pTVar8;
  undefined4 in_register_00000034;
  char *pcVar9;
  TPZMaterialDataT<double> *pTVar10;
  TPZGradSolVec<double> *pTVar11;
  int64_t newsize;
  TPZSolVec<double> *pTVar12;
  TPZVec<int> nshape;
  TPZVec<TPZMaterialDataT<double>_> datavec;
  TPZSolVec<double> *local_b8;
  TPZVec<int> local_78;
  TPZVec<TPZMaterialDataT<double>_> local_58;
  double local_38;
  
  lVar4 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xb8))
                    (this,CONCAT44(in_register_00000034,variable));
  if (lVar4 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error at ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "virtual void TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra>::Integrate(int, TPZVec<STATE> &) [TGeometry = pzgeom::TPZGeoTetrahedra]"
               ,0x84);
    pcVar9 = " : no material for this element\n";
    lVar4 = 0x20;
  }
  else {
    pTVar5 = TPZCompEl::Reference((TPZCompEl *)this);
    if (pTVar5 != (TPZGeoEl *)0x0) {
      newsize = (this->fElementVec).super_TPZVec<TPZCompElSide>.fNElements;
      local_58._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183ba30;
      local_58.fStore = (TPZMaterialDataT<double> *)0x0;
      local_58.fNElements = 0;
      local_58.fNAlloc = 0;
      TPZVec<TPZMaterialDataT<double>_>::Resize(&local_58,newsize);
      TPZVec<int>::TPZVec(&local_78,newsize);
      if (0 < newsize) {
        lVar4 = 0;
        lVar7 = 0;
        do {
          lVar1 = *(long *)((long)&((this->fElementVec).super_TPZVec<TPZCompElSide>.fStore)->fEl +
                           lVar7);
          if (lVar1 == 0) {
            plVar6 = (long *)0x0;
          }
          else {
            plVar6 = (long *)__dynamic_cast(lVar1,&TPZCompEl::typeinfo,
                                            &TPZInterpolationSpace::typeinfo,0);
          }
          if (plVar6 != (long *)0x0) {
            (**(code **)(*plVar6 + 0x298))
                      (plVar6,(long)((local_58.fStore)->super_TPZMaterialData).super_TPZShapeData.
                                    fCornerNodeIds.fExtAlloc + lVar4 + -0x30);
          }
          lVar7 = lVar7 + 0x10;
          lVar4 = lVar4 + 0x8230;
          newsize = newsize + -1;
        } while (newsize != 0);
      }
      local_38 = 0.0;
      TPZVec<double>::Fill(value,&local_38,0,-1);
      local_78._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
      if (local_78.fStore != (int *)0x0) {
        operator_delete__(local_78.fStore);
      }
      local_58._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183ba30;
      if (local_58.fStore != (TPZMaterialDataT<double> *)0x0) {
        pTVar3 = local_58.fStore + -1;
        dVar2 = local_58.fStore[-1].curlsol.fExtAlloc[0x13].fExtAlloc[9];
        if (dVar2 != 0.0) {
          lVar7 = (long)dVar2 * 0x8230;
          local_b8 = &local_58.fStore[-1].sol;
          pTVar11 = &local_58.fStore[-1].dsol;
          pTVar8 = &local_58.fStore[-1].divsol;
          pTVar12 = &local_58.fStore[-1].curlsol;
          lVar4 = 0;
          pTVar10 = local_58.fStore;
          do {
            pTVar10 = pTVar10 + -1;
            *(undefined ***)&pTVar10[(long)dVar2].super_TPZMaterialData.super_TPZShapeData =
                 &PTR__TPZMaterialDataT_018e86d8;
            *(undefined ***)&pTVar10[(long)dVar2].super_TPZMaterialData.super_TPZShapeData =
                 &PTR__TPZMaterialDataT_018e86d8;
            TPZManVector<TPZManVector<double,_10>,_20>::~TPZManVector
                      ((TPZManVector<TPZManVector<double,_10>,_20> *)((long)pTVar12 + lVar7));
            TPZManVector<TPZManVector<double,_10>,_20>::~TPZManVector
                      ((TPZManVector<TPZManVector<double,_10>,_20> *)((long)pTVar8 + lVar7));
            TPZManVector<TPZFNMatrix<30,_double>,_20>::~TPZManVector
                      ((TPZManVector<TPZFNMatrix<30,_double>,_20> *)((long)pTVar11 + lVar7));
            TPZManVector<TPZManVector<double,_10>,_20>::~TPZManVector
                      ((TPZManVector<TPZManVector<double,_10>,_20> *)((long)local_b8 + lVar7));
            TPZMaterialData::~TPZMaterialData
                      (&pTVar10[(long)dVar2].super_TPZMaterialData,&PTR_PTR_018e8740);
            local_b8 = (TPZSolVec<double> *)((long)(local_b8 + -0xf) + 0x2f0);
            pTVar11 = (TPZGradSolVec<double> *)((long)(pTVar11 + -5) + 0x1790);
            pTVar8 = (TPZSolVec<double> *)((long)(pTVar8 + -0xf) + 0x2f0);
            pTVar12 = (TPZSolVec<double> *)((long)(pTVar12 + -0xf) + 0x2f0);
            lVar4 = lVar4 + 0x8230;
          } while (lVar7 - lVar4 != 0);
        }
        operator_delete__((pTVar3->curlsol).fExtAlloc[0x13].fExtAlloc + 9,(long)dVar2 * 0x8230 | 8);
      }
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error at ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "virtual void TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra>::Integrate(int, TPZVec<STATE> &) [TGeometry = pzgeom::TPZGeoTetrahedra]"
               ,0x84);
    pcVar9 = " : no reference element\n";
    lVar4 = 0x18;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,lVar4);
  return;
}

Assistant:

void TPZMultiphysicsCompEl<TGeometry>::Integrate(int variable, TPZVec<STATE> & value){
    TPZMaterial * material = this->Material();
    if(!material){
        PZError << "Error at " << __PRETTY_FUNCTION__ << " : no material for this element\n";
        return;
    }
    if (!this->Reference()){
        PZError << "Error at " << __PRETTY_FUNCTION__ << " : no reference element\n";
        return;
    }
    
    int64_t nref = fElementVec.size();
    TPZVec<TPZMaterialDataT<STATE>> datavec;
    datavec.resize(nref);
    
#ifdef PZDEBUG
    if (nref != datavec.size()) {
        PZError << "Error at " << __PRETTY_FUNCTION__ << " The number of materials can not be different from the size of the fElementVec !\n";
        DebugStop();
    }
#endif
    
    TPZVec<int> nshape(nref);
    for (int64_t iref = 0; iref<nref; iref++)
    {
        
        TPZInterpolationSpace *msp  = dynamic_cast <TPZInterpolationSpace *>(fElementVec[iref].Element());
        if(!msp) continue;
        msp->InitMaterialData(datavec[iref]);
    }
    
    
    //	TPZManVector<REAL, 3> intpoint(dim,0.);
    //	const int varsize = material->NSolutionVariables(variable);
    //	value.Resize(varsize);
    value.Fill(0.);
    //
    //	const TPZIntPoints &intrule = this->GetIntegrationRule();
    //	int npoints = intrule.NPoints(), ip, iv;
    //	TPZManVector<REAL> sol(varsize);
    //	for(ip=0;ip<npoints;ip++){
    //		intrule.Point(ip,intpoint,weight);
    //		sol.Fill(0.);
    //		this->Solution(intpoint, variable, sol);
    //		//Tiago: Next call is performed only for computing detcaj. The previous method (Solution) has already computed jacobian.
    //		//       It means that the next call would not be necessary if I wrote the whole code here.
    //		this->Reference()->Jacobian(intpoint, data.jacobian, data.axes, data.detjac, data.jacinv);
    //		weight *= fabs(data.detjac);
    //		for(iv = 0; iv < varsize; iv++) {
    //#if !BUILD_COMPLEX_PROJECTS
    //			DebugStop();
    //#else
    //			value[iv] += sol[iv]*weight;
    //#endif
    //		}//for iv
    //	}//for ip
}